

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkForCustomUnit(string *unit_string)

{
  precise_unit pVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  precise_unit pVar6;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_169;
  size_t local_168;
  size_t custcode;
  char *local_158;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  undefined4 local_13c;
  precise_unit local_138;
  string local_128;
  uint32_t local_104;
  undefined1 local_100 [4];
  uint32_t hcode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> csub;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  byte local_29;
  long lStack_28;
  bool index;
  size_t loc;
  string *unit_string_local;
  undefined8 local_10;
  
  lStack_28 = -1;
  local_29 = 0;
  loc = (size_t)unit_string;
  pcVar5 = (char *)std::__cxx11::string::front();
  if ((*pcVar5 == '[') &&
     (pcVar5 = (char *)std::__cxx11::string::back(), sVar2 = loc, *pcVar5 == ']')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"U]",&local_51);
    bVar3 = ends_with((string *)sVar2,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    sVar2 = loc;
    if (bVar3) {
      lStack_28 = std::__cxx11::string::size();
      lStack_28 = lStack_28 + -2;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_88,"index]",&local_89);
      bVar3 = ends_with((string *)sVar2,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      if (bVar3) {
        lStack_28 = std::__cxx11::string::size();
        lStack_28 = lStack_28 + -6;
        local_29 = 1;
      }
    }
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::front();
    if ((*pcVar5 == '{') &&
       (pcVar5 = (char *)std::__cxx11::string::back(), sVar2 = loc, *pcVar5 == '}')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,"\'u}",&local_b1);
      bVar3 = ends_with((string *)sVar2,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      sVar2 = loc;
      if (bVar3) {
        lStack_28 = std::__cxx11::string::size();
        lStack_28 = lStack_28 + -3;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_d8,"index}",(allocator *)(csub.field_2._M_local_buf + 0xf));
        bVar3 = ends_with((string *)sVar2,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)(csub.field_2._M_local_buf + 0xf));
        if (bVar3) {
          lStack_28 = std::__cxx11::string::size();
          lStack_28 = lStack_28 + -6;
          local_29 = 1;
        }
      }
    }
  }
  if (lStack_28 == -1) {
    unit_string_local = (string *)0x7ff4000000000000;
    local_10._0_4_ = (unit_data)0xfa94a488;
    local_10._4_4_ = 0;
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::operator[](loc);
    if ((*pcVar5 == '\'') ||
       (pcVar5 = (char *)std::__cxx11::string::operator[](loc), *pcVar5 == '_')) {
      lStack_28 = lStack_28 + -1;
    }
    std::__cxx11::string::substr((ulong)local_100,loc);
    if ((local_29 & 1) == 0) {
      local_148._M_current = (char *)std::__cxx11::string::begin();
      local_150._M_current = (char *)std::__cxx11::string::end();
      local_158 = (char *)std::__cxx11::string::begin();
      custcode = (size_t)std::
                         transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                   (local_148,local_150,
                                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_158,tolower);
      local_168 = std::
                  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(&local_169,(string *)local_100);
      pVar6 = precise::generate_custom_unit((ushort)local_168 & 0x3f);
    }
    else {
      std::__cxx11::string::string((string *)&local_128,(string *)local_100);
      uVar4 = getCommodity(&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      local_104 = uVar4;
      local_138 = precise::generate_custom_count_unit(0);
      precise_unit::precise_unit((precise_unit *)&unit_string_local,1.0,&local_138,local_104);
      pVar6.base_units_ = local_10._0_4_;
      pVar6.commodity_ = local_10._4_4_;
      pVar6.multiplier_ = (double)unit_string_local;
    }
    local_10 = pVar6._8_8_;
    unit_string_local = (string *)pVar6.multiplier_;
    local_13c = 1;
    std::__cxx11::string::~string((string *)local_100);
  }
  pVar1.base_units_ = local_10._0_4_;
  pVar1.commodity_ = local_10._4_4_;
  pVar1.multiplier_ = (double)unit_string_local;
  return pVar1;
}

Assistant:

static precise_unit checkForCustomUnit(const std::string& unit_string)
{
    size_t loc = std::string::npos;
    bool index = false;
    if (unit_string.front() == '[' && unit_string.back() == ']') {
        if (ends_with(unit_string, "U]")) {
            loc = unit_string.size() - 2;
        } else if (ends_with(unit_string, "index]")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    } else if (unit_string.front() == '{' && unit_string.back() == '}') {
        if (ends_with(unit_string, "'u}")) {
            loc = unit_string.size() - 3;
        } else if (ends_with(unit_string, "index}")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    }
    if (loc != std::string::npos) {
        if ((unit_string[loc - 1] == '\'') || (unit_string[loc - 1] == '_')) {
            --loc;
        }
        auto csub = unit_string.substr(1, loc - 1);

        if (index) {
            auto hcode = getCommodity(csub);
            return {1.0, precise::generate_custom_count_unit(0), hcode};
        }

        std::transform(csub.begin(), csub.end(), csub.begin(), ::tolower);
        auto custcode = std::hash<std::string>{}(csub);
        return precise::generate_custom_unit(custcode & 0x3FU);
    }

    return precise::invalid;
}